

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O1

char * dup_str(char *s,char *e)

{
  size_t sVar1;
  char *__dest;
  int iVar2;
  
  if (e == (char *)0x0) {
    sVar1 = strlen(s);
    iVar2 = (int)sVar1;
  }
  else {
    iVar2 = (int)e - (int)s;
  }
  __dest = (char *)malloc((long)(iVar2 + 1));
  memcpy(__dest,s,(long)iVar2);
  __dest[iVar2] = '\0';
  return __dest;
}

Assistant:

char *dup_str(const char *s, const char *e) {
  int l = e ? e - s : strlen(s);
  char *ss = (char *)MALLOC(l + 1);
  memcpy(ss, s, l);
  ss[l] = 0;
  return ss;
}